

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int xmlCtxtGrowAttrs(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlChar **ppxVar2;
  uint *puVar3;
  uint uVar4;
  ulong uVar5;
  
  iVar1 = ctxt->maxatts;
  uVar5 = 10;
  if ((4 < iVar1) && (uVar5 = 0xffffffff, iVar1 < 500000000)) {
    iVar1 = iVar1 / 5;
    uVar4 = iVar1 + 1U >> 1;
    uVar5 = (ulong)(uVar4 + iVar1);
    if ((int)(100000000 - uVar4) < iVar1) {
      uVar5 = 100000000;
    }
  }
  if ((int)uVar5 < 0) {
    xmlFatalErr(ctxt,XML_ERR_RESOURCE_LIMIT,"Maximum number of attributes exceeded");
  }
  else {
    ppxVar2 = (xmlChar **)(*xmlRealloc)(ctxt->atts,uVar5 * 0x28);
    if (ppxVar2 != (xmlChar **)0x0) {
      ctxt->atts = ppxVar2;
      puVar3 = (uint *)(*xmlRealloc)(ctxt->attallocs,uVar5 << 2);
      if (puVar3 != (uint *)0x0) {
        ctxt->attallocs = puVar3;
        ctxt->maxatts = (int)uVar5 * 5;
        return 0;
      }
    }
    xmlCtxtErrMemory(ctxt);
  }
  return -1;
}

Assistant:

static int
xmlCtxtGrowAttrs(xmlParserCtxtPtr ctxt) {
    const xmlChar **atts;
    unsigned *attallocs;
    int newSize;

    newSize = xmlGrowCapacity(ctxt->maxatts / 5,
                              sizeof(atts[0]) * 5 + sizeof(attallocs[0]),
                              10, XML_MAX_ATTRS);
    if (newSize < 0) {
        xmlFatalErr(ctxt, XML_ERR_RESOURCE_LIMIT,
                    "Maximum number of attributes exceeded");
        return(-1);
    }

    atts = xmlRealloc(ctxt->atts, newSize * sizeof(atts[0]) * 5);
    if (atts == NULL)
        goto mem_error;
    ctxt->atts = atts;

    attallocs = xmlRealloc(ctxt->attallocs,
                           newSize * sizeof(attallocs[0]));
    if (attallocs == NULL)
        goto mem_error;
    ctxt->attallocs = attallocs;

    ctxt->maxatts = newSize * 5;

    return(0);

mem_error:
    xmlErrMemory(ctxt);
    return(-1);
}